

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Texture2DArray * __thiscall
tcu::Texture2DArray::operator=(Texture2DArray *this,Texture2DArray *other)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  Texture2DArrayView local_30;
  Texture2DArray *local_20;
  Texture2DArray *other_local;
  Texture2DArray *this_local;
  
  if (this != other) {
    local_20 = other;
    other_local = this;
    TextureLevelPyramid::operator=
              (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
    this->m_width = local_20->m_width;
    this->m_height = local_20->m_height;
    this->m_numLayers = local_20->m_numLayers;
    numLevels = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
    levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
              super_ConstPixelBufferAccess;
    Texture2DArrayView::Texture2DArrayView(&local_30,numLevels,levels);
    (this->m_view).m_numLevels = local_30.m_numLevels;
    *(undefined4 *)&(this->m_view).field_0x4 = local_30._4_4_;
    (this->m_view).m_levels = local_30.m_levels;
  }
  return this;
}

Assistant:

Texture2DArray& Texture2DArray::operator= (const Texture2DArray& other)
{
	if (this == &other)
		return *this;

	TextureLevelPyramid::operator=(other);

	m_width		= other.m_width;
	m_height	= other.m_height;
	m_numLayers	= other.m_numLayers;
	m_view		= Texture2DArrayView(getNumLevels(), getLevels());

	return *this;
}